

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O0

Card * card_createFromId(char *id)

{
  size_t sVar1;
  Card *pCVar2;
  char *in_RDI;
  char suit;
  char rank [3];
  char faceUp;
  SUIT in_stack_fffffffffffffff6;
  uchar in_stack_fffffffffffffff7;
  
  memset(&stack0xfffffffffffffff5,0,3);
  faceUp = *in_RDI;
  sVar1 = strlen(in_RDI);
  if (sVar1 == 3) {
    in_stack_fffffffffffffff6 = in_RDI[1];
  }
  atoi(&stack0xfffffffffffffff5);
  pCVar2 = card_create(in_stack_fffffffffffffff7,in_stack_fffffffffffffff6,(_Bool)faceUp);
  return pCVar2;
}

Assistant:

Card * card_createFromId(char * id)
{
	char rank[3] = {0, 0, 0};
	rank[0] = id[0];
	char suit = id[1];

	if(strlen(id)==3)
	{
		rank[1] = id[1];
		suit = id[2];
	}

	return card_create(atoi(rank), (suit=='s' ? SPADE : (suit=='c' ? CLUB : (suit=='h' ? HEART : DIAMOND))), true);
}